

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readPairs.hpp
# Opt level: O1

tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
__thiscall
njoy::ENDFtk::TabulationRecord::
readPairs<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,TabulationRecord *this,long nPairs,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  _Head_base<0UL,_std::vector<double,_std::allocator<double>_>,_false> *xValues;
  void *pvVar1;
  int in_stack_ffffffffffffffb8;
  undefined4 uStack_44;
  pointer local_38;
  pointer local_30 [2];
  pointer local_20;
  
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  ).super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  ).super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           ).super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
           super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (pointer)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  ).super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  ).super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
  super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start = 0;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           ).super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
           super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  record::Zipper::
  unzip<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
              *)&stack0xffffffffffffffb8,(Zipper *)this,nPairs,it,end,lineNumber,MAT,MF,
             in_stack_ffffffffffffffb8);
  xValues = &(__return_storage_ptr__->
             super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
             ).super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>,_false>;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&xValues->_M_head_impl,local_30);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,
             &stack0xffffffffffffffb8);
  if (local_30[0] != (pointer)0x0) {
    operator_delete(local_30[0],(long)local_20 - (long)local_30[0]);
  }
  pvVar1 = (void *)CONCAT44(uStack_44,in_stack_ffffffffffffffb8);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_38 - (long)pvVar1);
  }
  verifyXValuesAreSorted(&xValues->_M_head_impl);
  return __return_storage_ptr__;
}

Assistant:

static std::tuple< std::vector< double >, std::vector< double > >
readPairs
( long nPairs, Iterator& it, const Iterator& end, long& lineNumber,
  int MAT, int MF, int MT ){
  std::tuple< std::vector< double >, std::vector< double > > result;
  try{
    
    result = record::Zipper::unzip
             < record::Real, record::Real >
             ( nPairs, it, end, lineNumber, MAT, MF, MT );
    auto& xValues = std::get< 0 >( result );
    verifyXValuesAreSorted( xValues );
    return result;
  } catch ( std::exception& e ){
    Log::info( "Error while reading TAB1 ordered pairs" );
    throw e; 
  }
}